

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int store_config_flag(lys_node *node,int options)

{
  LYS_NODE LVar1;
  int options_local;
  lys_node *node_local;
  
  LVar1 = node->nodetype;
  if ((((1 < LVar1 - LYS_CONTAINER) && (LVar1 != LYS_LEAF)) && (LVar1 != LYS_LEAFLIST)) &&
     ((LVar1 != LYS_LIST && (LVar1 != LYS_ANYXML)))) {
    if (LVar1 == LYS_CASE) {
      if ((options & 3U) != 0) {
        return 0;
      }
      if ((node->flags & 3) != 0) {
        return 0;
      }
      if (node->parent != (lys_node *)0x0) {
        node->flags = node->flags | node->parent->flags & 3;
        return 0;
      }
      node->flags = node->flags | 1;
      return 0;
    }
    if (LVar1 != LYS_ANYDATA) {
      return 0;
    }
  }
  if ((options & 2U) == 0) {
    if (((options & 1U) == 0) && ((node->flags & 3) == 0)) {
      if (node->parent == (lys_node *)0x0) {
        node->flags = node->flags | 1;
      }
      else {
        node->flags = node->flags | node->parent->flags & 3;
      }
    }
  }
  else {
    node->flags = node->flags | node->flags & 0xfff8;
  }
  return 0;
}

Assistant:

int
store_config_flag(struct lys_node *node, int options)
{
    switch (node->nodetype) {
    case LYS_CONTAINER:
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_LIST:
    case LYS_CHOICE:
    case LYS_ANYDATA:
    case LYS_ANYXML:
        if (options & LYS_PARSE_OPT_CFG_IGNORE) {
            node->flags |= node->flags & (~(LYS_CONFIG_MASK | LYS_CONFIG_SET));
        } else if (!(options & LYS_PARSE_OPT_CFG_NOINHERIT)) {
            if (!(node->flags & LYS_CONFIG_MASK)) {
                /* get config flag from parent */
                if (node->parent) {
                    node->flags |= node->parent->flags & LYS_CONFIG_MASK;
                } else {
                    /* default config is true */
                    node->flags |= LYS_CONFIG_W;
                }
            }
        }
        break;
    case LYS_CASE:
        if (!(options & (LYS_PARSE_OPT_CFG_IGNORE | LYS_PARSE_OPT_CFG_NOINHERIT))) {
            if (!(node->flags & LYS_CONFIG_MASK)) {
                /* get config flag from parent */
                if (node->parent) {
                    node->flags |= node->parent->flags & LYS_CONFIG_MASK;
                } else {
                    /* default config is true */
                    node->flags |= LYS_CONFIG_W;
                }
            }
        }
        break;
    default:
        break;
    }

    return EXIT_SUCCESS;
}